

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O2

void diy::detail::SampleSort<Block<float>,_float,_std::less<float>_>::dequeue_values
               (vector<float,_std::allocator<float>_> *v,ReduceProxy *rp,bool skip_self)

{
  int iVar1;
  pointer __src;
  MemoryBuffer *pMVar2;
  long lVar3;
  int i;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  shared_ptr<diy::spd::logger> log;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::make_shared<diy::spd::logger>();
  uVar5 = (ulong)((long)(rp->in_link_).neighbors_.
                        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(rp->in_link_).neighbors_.
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  lVar3 = (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  uVar7 = 0;
  uVar6 = uVar5 & 0xffffffff;
  if ((int)uVar5 < 1) {
    uVar6 = uVar7;
  }
  lVar4 = 0;
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    iVar1 = (rp->in_link_).neighbors_.
            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7].gid;
    if ((!skip_self) || ((rp->super_Proxy).gid_ != iVar1)) {
      pMVar2 = Master::Proxy::incoming(&rp->super_Proxy,iVar1);
      lVar4 = lVar4 + ((ulong)((long)(pMVar2->buffer).
                                     super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pMVar2->buffer).super__Vector_base<char,_std::allocator<char>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2);
    }
  }
  std::vector<float,_std::allocator<float>_>::resize(v,lVar4 + lVar3);
  for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    iVar1 = (rp->in_link_).neighbors_.
            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5].gid;
    if ((!skip_self) || ((rp->super_Proxy).gid_ != iVar1)) {
      pMVar2 = Master::Proxy::incoming(&rp->super_Proxy,iVar1);
      __src = (pMVar2->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
      uVar7 = (long)(pMVar2->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src;
      if (3 < uVar7) {
        memmove((v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start + lVar3,__src,uVar7 & 0xfffffffffffffffc);
      }
      lVar3 = lVar3 + (uVar7 >> 2);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  return;
}

Assistant:

static void     dequeue_values(std::vector<T>& v, const ReduceProxy& rp, bool skip_self = true)
    {
        auto log = get_logger();

        int k_in  = rp.in_link().size();

        log->trace("dequeue_values(): gid={}, round={}; v.size()={}", rp.gid(), rp.round(), v.size());

        if (detail::is_default< Serialization<T> >::value)
        {
            // add up sizes
            size_t sz = 0;
            size_t end = v.size();
            for (int i = 0; i < k_in; ++i)
            {
                log->trace("    incoming size from {}: {}", rp.in_link().target(i).gid, sz);
                if (skip_self && rp.in_link().target(i).gid == rp.gid()) continue;
                MemoryBuffer& in = rp.incoming(rp.in_link().target(i).gid);
                sz += in.size() / sizeof(T);
            }
            log->trace("    incoming size: {}", sz);
            v.resize(end + sz);

            for (int i = 0; i < k_in; ++i)
            {
                if (skip_self && rp.in_link().target(i).gid == rp.gid()) continue;
                MemoryBuffer& in = rp.incoming(rp.in_link().target(i).gid);
                size_t incoming_sz = in.size() / sizeof(T);
                T* bg = (T*) &in.buffer[0];
                std::copy(bg, bg + incoming_sz, &v[end]);
                end += incoming_sz;
            }
        } else
        {
            for (int i = 0; i < k_in; ++i)
            {
                if (skip_self && rp.in_link().target(i).gid == rp.gid()) continue;
                MemoryBuffer& in = rp.incoming(rp.in_link().target(i).gid);
                while(in)
                {
                    T x;
                    diy::load(in, x);
                    v.emplace_back(std::move(x));
                }
            }
        }
        log->trace("    v.size()={}", v.size());
    }